

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

void dlist_erase(vmd_bst_node_t **list,vmd_bst_node_t *node)

{
  vmd_bst_node_t *pvVar1;
  
  pvVar1 = node->child[0];
  if (pvVar1 != node) {
    if (*list == node) {
      *list = pvVar1;
      pvVar1 = node->child[0];
    }
    node->child[1]->child[0] = pvVar1;
    node->child[0]->child[1] = node->child[1];
    return;
  }
  *list = (vmd_bst_node_t *)0x0;
  return;
}

Assistant:

static void
dlist_erase(bst_node_t **list, bst_node_t *node)
{
	if (node->child[0] == node) {
		*list = NULL;
		return;
	}

	if (*list == node)
		*list = node->child[0];

	node->child[1]->child[0] = node->child[0];
	node->child[0]->child[1] = node->child[1];
}